

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

void __thiscall
TPZMatrix<double>::PrepareZ
          (TPZMatrix<double> *this,TPZFMatrix<double> *y,TPZFMatrix<double> *z,double beta,int opt)

{
  long lVar1;
  double *pdVar2;
  long col;
  int64_t i;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar1 = (&(this->super_TPZBaseMatrix).fRow)[opt != 0];
  lVar3 = (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  (*(z->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (z,lVar1,lVar3);
  col = 0;
  lVar5 = lVar1;
  if (lVar1 < 1) {
    lVar5 = col;
  }
  if (lVar3 < 1) {
    lVar3 = col;
  }
  for (; col != lVar3; col = col + 1) {
    pdVar2 = TPZFMatrix<double>::operator()(z,0,col);
    if ((beta != 0.0) || (NAN(beta))) {
      if (z != y) {
        memcpy(pdVar2,y->fElem + (y->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * col,
               lVar1 * 8);
      }
      for (lVar4 = 0; lVar5 != lVar4; lVar4 = lVar4 + 1) {
        pdVar2 = TPZFMatrix<double>::operator()(z,lVar4,col);
        *pdVar2 = *pdVar2 * beta;
      }
    }
    else {
      for (lVar4 = 0; lVar1 * 8 - lVar4 != 0; lVar4 = lVar4 + 8) {
        *(undefined8 *)((long)pdVar2 + lVar4) = 0;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::PrepareZ(const TPZFMatrix<TVar> &y, TPZFMatrix<TVar> &z,const TVar beta,const int opt) const
{
	int64_t numeq = (opt) ? Cols() : Rows();
	int64_t xcols = y.Cols();
	int64_t ic;
	z.Resize(numeq, xcols);
	for (ic = 0; ic < xcols; ic++)
	{
		TVar *zp = &z(0,ic), *zlast = zp+numeq;
		if(beta != (TVar)0)
		{
			const TVar *yp = &y.g(0,ic);
            if(&z != &y)
			{
				memcpy((void *)(zp),(void *)(yp),numeq*sizeof(TVar));
			}
            for (int64_t i=0; i<numeq; i++) {
                z(i,ic) *= beta;
            }
		} else
		{
			while(zp != zlast)
			{
				*zp = 0.;
				zp ++;
			}
		}
	}
}